

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtFlip(word *pTruth,int nWords,int iVar)

{
  word *pwVar1;
  word wVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  bVar4 = (byte)iVar;
  if (nWords != 1) {
    if (iVar < 6) {
      uVar7 = 0;
      uVar8 = (ulong)(uint)nWords;
      if (nWords < 1) {
        uVar8 = uVar7;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        bVar5 = (byte)(1 << (bVar4 & 0x1f));
        pTruth[uVar7] =
             (s_Truths6[iVar] & pTruth[uVar7]) >> (bVar5 & 0x3f) |
             pTruth[uVar7] << (bVar5 & 0x3f) & s_Truths6[iVar];
      }
    }
    else {
      pwVar1 = pTruth + nWords;
      uVar6 = 1 << (bVar4 - 6 & 0x1f);
      uVar3 = 0;
      if (0 < (int)uVar6) {
        uVar3 = uVar6;
      }
      for (; pTruth < pwVar1; pTruth = pTruth + (2 << (bVar4 - 6 & 0x1f))) {
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          wVar2 = pTruth[uVar8];
          pTruth[uVar8] = pTruth[(long)(int)uVar6 + uVar8];
          pTruth[(long)(int)uVar6 + uVar8] = wVar2;
        }
      }
    }
    return;
  }
  bVar4 = (byte)(1 << (bVar4 & 0x1f));
  *pTruth = (s_Truths6[iVar] & *pTruth) >> (bVar4 & 0x3f) |
            *pTruth << (bVar4 & 0x3f) & s_Truths6[iVar];
  return;
}

Assistant:

static inline void Abc_TtFlip( word * pTruth, int nWords, int iVar )
{
    if ( nWords == 1 )
        pTruth[0] = ((pTruth[0] << (1 << iVar)) & s_Truths6[iVar]) | ((pTruth[0] & s_Truths6[iVar]) >> (1 << iVar));
    else if ( iVar <= 5 )
    {
        int w, shift = (1 << iVar);
        for ( w = 0; w < nWords; w++ )
            pTruth[w] = ((pTruth[w] << shift) & s_Truths6[iVar]) | ((pTruth[w] & s_Truths6[iVar]) >> shift);
    }
    else // if ( iVar > 5 )
    {
        word * pLimit = pTruth + nWords;
        int i, iStep = Abc_TtWordNum(iVar);
        for ( ; pTruth < pLimit; pTruth += 2*iStep )
            for ( i = 0; i < iStep; i++ )
                ABC_SWAP( word, pTruth[i], pTruth[i + iStep] );
    }    
}